

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

unsigned_short tinyexr::reverseLutFromBitmap(uchar *bitmap,unsigned_short *lut)

{
  int i;
  uint uVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  uVar1 = 0;
  do {
    if ((uVar1 == 0) || ((bitmap[uVar1 >> 3] >> (uVar1 & 7) & 1) != 0)) {
      lVar2 = (long)iVar3;
      iVar3 = iVar3 + 1;
      lut[lVar2] = (unsigned_short)uVar1;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x10000);
  if (iVar3 < 0x10000) {
    memset(lut + iVar3,0,(ulong)(0xffff - iVar3) * 2 + 2);
  }
  return (short)iVar3 - 1;
}

Assistant:

unsigned short reverseLutFromBitmap(const unsigned char bitmap[BITMAP_SIZE],
                                    unsigned short lut[USHORT_RANGE]) {
  int k = 0;

  for (int i = 0; i < USHORT_RANGE; ++i) {
    if ((i == 0) || (bitmap[i >> 3] & (1 << (i & 7)))) lut[k++] = i;
  }

  int n = k - 1;

  while (k < USHORT_RANGE) lut[k++] = 0;

  return n;  // maximum k where lut[k] is non-zero,
}